

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[25],unsigned_long,char[48],unsigned_long,char[2]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [25],unsigned_long *RestArgs,char (*RestArgs_1) [48],
               unsigned_long *RestArgs_2,char (*RestArgs_3) [2])

{
  char (*RestArgs_local_3) [2];
  unsigned_long *RestArgs_local_2;
  char (*RestArgs_local_1) [48];
  unsigned_long *RestArgs_local;
  char (*FirstArg_local) [25];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[25]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_long,char[48],unsigned_long,char[2]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}